

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

void mine<true>(randomx_vm *vm,atomic<unsigned_int> *atomicNonce,AtomicHash *result,
               uint32_t noncesCount,int thread,int cpuid)

{
  uint uVar1;
  int i;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  uint8_t *puVar5;
  uint *puVar6;
  byte bVar7;
  uint64_t hash [4];
  uint8_t blockTemplate [76];
  ulong local_a8 [4];
  uint local_88 [9];
  uint local_61;
  undefined4 local_40;
  
  bVar7 = 0;
  if (-1 < cpuid) {
    local_88[0] = cpuid;
    iVar2 = set_thread_affinity(local_88);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to set thread affinity for thread ",0x29);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,thread);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," (error=",8);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
  }
  puVar5 = blockTemplate_;
  puVar6 = local_88;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)puVar6 = *(undefined8 *)puVar5;
    puVar5 = puVar5 + ((ulong)bVar7 * -2 + 1) * 8;
    puVar6 = puVar6 + ((ulong)bVar7 * -2 + 1) * 2;
  }
  local_40 = 0x961d561;
  LOCK();
  uVar1 = (atomicNonce->super___atomic_base<unsigned_int>)._M_i;
  (atomicNonce->super___atomic_base<unsigned_int>)._M_i =
       (atomicNonce->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  local_61 = uVar1;
  randomx_calculate_hash_first(vm,local_88,0x4c);
  if (uVar1 < noncesCount) {
    do {
      LOCK();
      uVar1 = (atomicNonce->super___atomic_base<unsigned_int>)._M_i;
      (atomicNonce->super___atomic_base<unsigned_int>)._M_i =
           (atomicNonce->super___atomic_base<unsigned_int>)._M_i + 1;
      UNLOCK();
      local_61 = uVar1;
      randomx_calculate_hash_next(vm,local_88,0x4c,local_a8);
      lVar4 = 0;
      do {
        LOCK();
        result->hash[lVar4].super___atomic_base<unsigned_long>._M_i =
             result->hash[lVar4].super___atomic_base<unsigned_long>._M_i ^ local_a8[lVar4];
        UNLOCK();
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
    } while (uVar1 < noncesCount);
  }
  return;
}

Assistant:

void mine(randomx_vm* vm, std::atomic<uint32_t>& atomicNonce, AtomicHash& result, uint32_t noncesCount, int thread, int cpuid = -1) {
	if (cpuid >= 0) {
		int rc = set_thread_affinity(cpuid);
		if (rc) {
			std::cerr << "Failed to set thread affinity for thread " << thread << " (error=" << rc << ")" << std::endl;
		}
	}
	uint64_t hash[RANDOMX_HASH_SIZE / sizeof(uint64_t)];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	void* noncePtr = blockTemplate + 39;
	auto nonce = atomicNonce.fetch_add(1);

	if (batch) {
		store32(noncePtr, nonce);
		randomx_calculate_hash_first(vm, blockTemplate, sizeof(blockTemplate));
	}

	while (nonce < noncesCount) {
		if (batch) {
			nonce = atomicNonce.fetch_add(1);
		}
		store32(noncePtr, nonce);
		(batch ? randomx_calculate_hash_next : randomx_calculate_hash)(vm, blockTemplate, sizeof(blockTemplate), &hash);
		result.xorWith(hash);
		if (!batch) {
			nonce = atomicNonce.fetch_add(1);
		}
	}
}